

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint _c;
  int iVar2;
  size_t _elemsize;
  float *pfVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar20;
  int k;
  Layer *pLVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  uint uVar35;
  void *pvVar36;
  int i_5;
  uint uVar37;
  int _h;
  int iVar38;
  int iVar39;
  int _w;
  size_type __n;
  long lVar40;
  int iVar41;
  int q;
  ulong uVar42;
  ulong uVar43;
  int i_1;
  int iVar44;
  ulong uVar45;
  float fVar46;
  int local_bc8;
  int local_bc0;
  long local_ba0;
  long local_b98;
  Option opt_g;
  float local_b38;
  Mat m;
  Mat weights [4];
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g_1;
  Mat top_blob_g;
  Mat bottom_blob_unbordered;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined3 uVar8;
  undefined1 uVar9;
  undefined2 uVar10;
  undefined1 uVar11;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined3 uVar23;
  undefined1 uVar24;
  undefined2 uVar25;
  undefined1 uVar26;
  
  if (this->kernel_h == 1 && (this->kernel_w == 1 && bottom_blob->dims == 1)) {
    iVar38 = bottom_blob->w;
    if (iVar38 == this->weight_data_size / this->num_output) {
      pLVar27 = create_layer(0xf);
      ParamDict::ParamDict((ParamDict *)&bottom_blob_unbordered);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,0,this->num_output);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,1,this->bias_term);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,2,this->weight_data_size);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,8,this->int8_scale_term);
      (*pLVar27->_vptr_Layer[2])(pLVar27,&bottom_blob_unbordered);
      lVar28 = 0;
      do {
        *(undefined8 *)((long)&weights[0].refcount + lVar28 + 4) = 0;
        *(undefined8 *)((long)&weights[0].elemsize + lVar28 + 4) = 0;
        *(undefined8 *)((long)&weights[0].data + lVar28) = 0;
        *(undefined8 *)((long)&weights[0].refcount + lVar28) = 0;
        *(undefined8 *)((long)&weights[0].allocator + lVar28) = 0;
        *(undefined8 *)((long)&weights[0].dims + lVar28) = 0;
        *(undefined8 *)((long)&weights[0].h + lVar28) = 0;
        *(undefined8 *)((long)&weights[0].cstep + lVar28) = 0;
        lVar28 = lVar28 + 0x40;
      } while (lVar28 != 0x100);
      Mat::operator=(weights,&this->weight_data);
      Mat::operator=(weights + 1,&this->bias_data);
      if (this->int8_scale_term != 0) {
        Mat::operator=(weights + 2,&this->weight_data_int8_scales);
        opt_g._0_8_ = &this->bottom_blob_int8_scale;
        opt_g.blob_allocator._0_4_ = 0;
        opt_g.blob_allocator._4_4_ = 0;
        opt_g.workspace_allocator._0_4_ = 4;
        opt_g.workspace_allocator._4_4_ = 0;
        opt_g.use_winograd_convolution = true;
        opt_g.use_sgemm_convolution = false;
        opt_g.use_int8_inference = false;
        opt_g.use_vulkan_compute = false;
        opt_g.use_int8_arithmetic = false;
        opt_g.use_packing_layout = false;
        opt_g._34_6_ = 0;
        Mat::operator=(weights + 3,(Mat *)&opt_g);
        Mat::~Mat((Mat *)&opt_g);
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&opt_g,weights);
      (*pLVar27->_vptr_Layer[3])(pLVar27,&opt_g);
      ModelBin::~ModelBin((ModelBin *)&opt_g);
      (*pLVar27->_vptr_Layer[4])(pLVar27,opt);
      (*pLVar27->_vptr_Layer[7])(pLVar27,bottom_blob,top_blob,opt);
      (*pLVar27->_vptr_Layer[1])(pLVar27);
      lVar28 = 0xc0;
      do {
        Mat::~Mat((Mat *)((long)&weights[0].data + lVar28));
        lVar28 = lVar28 + -0x40;
      } while (lVar28 != -0x40);
      ParamDict::~ParamDict((ParamDict *)&bottom_blob_unbordered);
      return 0;
    }
  }
  else {
    iVar38 = bottom_blob->w;
  }
  iVar44 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar37 = (this->kernel_w + -1) * this->dilation_w;
  _elemsize = bottom_blob->elemsize;
  uVar35 = (this->kernel_h + -1) * this->dilation_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if ((_elemsize != 1 & this->use_int8_inference) == 1) {
    weights[0].elemsize._0_4_ = 0;
    weights[0].elemsize._4_4_ = 0;
    weights[0].elempack = 0;
    weights[0].data = (void *)0x0;
    weights[0].refcount._0_4_ = 0;
    weights[0].refcount._4_4_ = 0;
    weights[0].allocator = (Allocator *)0x0;
    weights[0].dims = 0;
    weights[0].w = 0;
    weights[0].h = 0;
    weights[0].c = 0;
    weights[0].cstep = 0;
    Mat::create(weights,iVar38,iVar44,_c,1,opt->workspace_allocator);
    local_bc0 = -100;
    bVar4 = true;
    if ((weights[0].data != (void *)0x0) && ((long)weights[0].c * weights[0].cstep != 0)) {
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
      opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
      opt_g.blob_allocator._0_4_ = SUB84(weights[0].allocator,0);
      opt_g.blob_allocator._4_4_ = (undefined4)((ulong)weights[0].allocator >> 0x20);
      (*this->quantize->_vptr_Layer[7])(this->quantize,bottom_blob);
      bVar4 = false;
      Mat::operator=(&bottom_blob_unbordered,weights);
      local_bc0 = 0;
    }
    Mat::~Mat(weights);
    if (bVar4) goto LAB_00120a0e;
  }
  weights[0].data = bottom_blob_unbordered.data;
  weights[0].refcount._0_4_ = SUB84(bottom_blob_unbordered.refcount,0);
  weights[0].refcount._4_4_ = (undefined4)((ulong)bottom_blob_unbordered.refcount >> 0x20);
  weights[0].elemsize._0_4_ = (undefined4)bottom_blob_unbordered.elemsize;
  weights[0].elemsize._4_4_ = (undefined4)(bottom_blob_unbordered.elemsize >> 0x20);
  weights[0].elempack = bottom_blob_unbordered.elempack;
  weights[0].allocator = bottom_blob_unbordered.allocator;
  weights[0].dims = bottom_blob_unbordered.dims;
  weights[0].w = bottom_blob_unbordered.w;
  weights[0].h = bottom_blob_unbordered.h;
  weights[0].c = bottom_blob_unbordered.c;
  weights[0].cstep = bottom_blob_unbordered.cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  iVar41 = this->pad_left;
  iVar2 = this->pad_right;
  if (((iVar2 < 1 && iVar41 < 1) && (iVar39 = this->pad_top, iVar39 < 1)) &&
     (iVar30 = this->pad_bottom, iVar30 < 1)) {
    if (iVar30 == -0xe9 && (iVar39 == -0xe9 && (iVar2 == -0xe9 && iVar41 == -0xe9))) {
      iVar41 = uVar37 - (iVar38 + -1) % this->stride_w;
      iVar38 = uVar35 - (iVar44 + -1) % this->stride_h;
      if ((0 < iVar41) || (0 < iVar38)) {
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        uVar13._0_1_ = opt->use_winograd_convolution;
        uVar13._1_1_ = opt->use_sgemm_convolution;
        uVar13._2_1_ = opt->use_int8_inference;
        uVar13._3_1_ = opt->use_vulkan_compute;
        uVar14 = opt->use_fp16_packed;
        uVar15 = opt->use_fp16_storage;
        uVar17 = opt->use_fp16_arithmetic;
        uVar19 = opt->use_int8_storage;
        uVar18 = CONCAT11(uVar19,uVar17);
        uVar16 = CONCAT21(uVar18,uVar15);
        uVar13._4_4_ = CONCAT31(uVar16,uVar14);
        opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._24_4_ = SUB84(uVar13,0);
        opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._28_4_ = uVar13._4_4_;
        copy_make_border(&bottom_blob_unbordered,weights,iVar38 / 2,iVar38 - iVar38 / 2,iVar41 / 2,
                         iVar41 - iVar41 / 2,0,this->pad_value,&opt_g);
      }
    }
    else if (iVar30 == -0xea && (iVar39 == -0xea && (iVar2 == -0xea && iVar41 == -0xea))) {
      iVar41 = uVar37 - (iVar38 + -1) % this->stride_w;
      iVar38 = uVar35 - (iVar44 + -1) % this->stride_h;
      if ((0 < iVar41) || (0 < iVar38)) {
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        uVar20._0_1_ = opt->use_winograd_convolution;
        uVar20._1_1_ = opt->use_sgemm_convolution;
        uVar20._2_1_ = opt->use_int8_inference;
        uVar20._3_1_ = opt->use_vulkan_compute;
        uVar21 = opt->use_fp16_packed;
        uVar22 = opt->use_fp16_storage;
        uVar24 = opt->use_fp16_arithmetic;
        uVar26 = opt->use_int8_storage;
        uVar25 = CONCAT11(uVar26,uVar24);
        uVar23 = CONCAT21(uVar25,uVar22);
        uVar20._4_4_ = CONCAT31(uVar23,uVar21);
        opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._24_4_ = SUB84(uVar20,0);
        opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_g._28_4_ = uVar20._4_4_;
        copy_make_border(&bottom_blob_unbordered,weights,iVar38 - iVar38 / 2,iVar38 / 2,
                         iVar41 - iVar41 / 2,iVar41 / 2,0,this->pad_value,&opt_g);
      }
    }
  }
  else {
    opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_g.use_packing_layout = opt->use_packing_layout;
    opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    uVar5._0_1_ = opt->use_winograd_convolution;
    uVar5._1_1_ = opt->use_sgemm_convolution;
    uVar5._2_1_ = opt->use_int8_inference;
    uVar5._3_1_ = opt->use_vulkan_compute;
    uVar6 = opt->use_fp16_packed;
    uVar7 = opt->use_fp16_storage;
    uVar9 = opt->use_fp16_arithmetic;
    uVar11 = opt->use_int8_storage;
    uVar10 = CONCAT11(uVar11,uVar9);
    uVar8 = CONCAT21(uVar10,uVar7);
    uVar5._4_4_ = CONCAT31(uVar8,uVar6);
    opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_g._24_4_ = SUB84(uVar5,0);
    opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_g._28_4_ = uVar5._4_4_;
    copy_make_border(&bottom_blob_unbordered,weights,this->pad_top,this->pad_bottom,iVar41,iVar2,0,
                     this->pad_value,&opt_g);
  }
  local_bc8 = -100;
  if ((weights[0].data != (void *)0x0) && ((long)weights[0].c * weights[0].cstep != 0)) {
    iVar39 = weights[0].w;
    iVar41 = (int)(~uVar37 + weights[0].w) / this->stride_w;
    iVar2 = (int)(~uVar35 + weights[0].h) / this->stride_h;
    uVar35 = this->kernel_w * this->kernel_h;
    __n = (size_type)(int)uVar35;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&opt_g);
    _w = iVar41 + 1;
    _h = iVar2 + 1;
    iVar38 = this->dilation_h;
    iVar44 = this->kernel_w;
    iVar30 = this->dilation_w * iVar44;
    iVar33 = 0;
    lVar28 = 0;
    for (iVar31 = 0; iVar31 < this->kernel_h; iVar31 = iVar31 + 1) {
      for (lVar40 = 0; (int)lVar40 < iVar44; lVar40 = lVar40 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar28 + lVar40] = iVar33;
        iVar33 = iVar33 + this->dilation_w;
        iVar44 = this->kernel_w;
      }
      iVar33 = iVar33 + (iVar39 * iVar38 - iVar30);
      lVar28 = (int)lVar28 + lVar40;
    }
    if (this->use_int8_inference == false) {
      Mat::create(top_blob,_w,_h,this->num_output,_elemsize,opt->blob_allocator);
      local_bc8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_bc8 = 0;
        uVar42 = 0;
        if (0 < (int)uVar35) {
          uVar42 = (ulong)uVar35;
        }
        uVar34 = 0;
        if (0 < (int)_c) {
          uVar34 = (ulong)_c;
        }
        iVar38 = 0;
        for (lVar28 = 0; lVar28 < this->num_output; lVar28 = lVar28 + 1) {
          Mat::channel((Mat *)&opt_g,top_blob,(int)lVar28);
          local_b98._0_1_ = opt_g.lightmode;
          local_b98._1_3_ = opt_g._1_3_;
          local_b98._4_4_ = opt_g.num_threads;
          Mat::~Mat((Mat *)&opt_g);
          for (iVar44 = 0; iVar44 <= iVar2; iVar44 = iVar44 + 1) {
            for (lVar40 = 0; lVar40 <= iVar41; lVar40 = lVar40 + 1) {
              if (this->bias_term == 0) {
                local_b38 = 0.0;
              }
              else {
                local_b38 = *(float *)((long)(this->bias_data).data + lVar28 * 4);
              }
              pvVar36 = (void *)((long)(this->weight_data).data + (long)iVar38 * 4);
              for (uVar45 = 0; uVar45 != uVar34; uVar45 = uVar45 + 1) {
                opt_g._0_8_ = weights[0].cstep * uVar45 *
                              CONCAT44(weights[0].elemsize._4_4_,(undefined4)weights[0].elemsize) +
                              (long)weights[0].data;
                opt_g.blob_allocator._0_4_ = 0;
                opt_g.blob_allocator._4_4_ = 0;
                opt_g.workspace_allocator._0_4_ = (undefined4)weights[0].elemsize;
                opt_g.workspace_allocator._4_4_ = weights[0].elemsize._4_4_;
                opt_g.use_winograd_convolution = (bool)(undefined1)weights[0].elempack;
                opt_g.use_sgemm_convolution = (bool)weights[0].elempack._1_1_;
                opt_g.use_int8_inference = (bool)weights[0].elempack._2_1_;
                opt_g.use_vulkan_compute = (bool)weights[0].elempack._3_1_;
                opt_g._32_8_ = weights[0].allocator;
                for (uVar32 = 0; uVar42 != uVar32; uVar32 = uVar32 + 1) {
                  local_b38 = local_b38 +
                              *(float *)((long)pvVar36 + uVar32 * 4) *
                              *(float *)(opt_g._0_8_ +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar32] * 4 +
                                        (long)this->stride_w * (long)(int)lVar40 * 4 +
                                        (long)(weights[0].w * iVar44 * this->stride_h) *
                                        CONCAT44(weights[0].elemsize._4_4_,
                                                 (undefined4)weights[0].elemsize));
                }
                Mat::~Mat((Mat *)&opt_g);
                pvVar36 = (void *)((long)pvVar36 + __n * 4);
              }
              switch(this->activation_type) {
              case 1:
                if (local_b38 <= 0.0) {
                  local_b38 = 0.0;
                }
                break;
              case 2:
                local_b38 = local_b38 *
                            (float)(~-(uint)(0.0 < local_b38) & *(this->activation_params).data |
                                   -(uint)(0.0 < local_b38) & 0x3f800000);
                break;
              case 3:
                pfVar3 = (float *)(this->activation_params).data;
                fVar46 = pfVar3[1];
                fVar1 = *pfVar3;
                if (local_b38 <= fVar1) {
                  local_b38 = fVar1;
                }
                if (fVar46 < local_b38) {
                  local_b38 = fVar46;
                }
                break;
              case 4:
                fVar46 = expf(-local_b38);
                local_b38 = 1.0 / (fVar46 + 1.0);
              }
              *(float *)(local_b98 + lVar40 * 4) = local_b38;
            }
            local_b98 = local_b98 + (long)_w * 4;
          }
          iVar38 = iVar38 + _c * uVar35;
        }
      }
    }
    else if (this->use_int8_requantize == true) {
      opt_g.workspace_allocator._0_4_ = 0;
      opt_g.workspace_allocator._4_4_ = 0;
      opt_g.use_winograd_convolution = false;
      opt_g.use_sgemm_convolution = false;
      opt_g.use_int8_inference = false;
      opt_g.use_vulkan_compute = false;
      opt_g.lightmode = false;
      opt_g._1_3_ = 0;
      opt_g.num_threads = 0;
      opt_g.blob_allocator._0_4_ = 0;
      opt_g.blob_allocator._4_4_ = 0;
      opt_g.use_int8_arithmetic = false;
      opt_g.use_packing_layout = false;
      opt_g._34_6_ = 0;
      Mat::create((Mat *)&opt_g,_w,_h,this->num_output,4,opt->workspace_allocator);
      local_bc8 = -100;
      Mat::~Mat((Mat *)&opt_g);
    }
    else {
      Mat::create(top_blob,_w,_h,this->num_output,4,opt->blob_allocator);
      local_bc8 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar34 = 0;
        uVar42 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar42 = uVar34;
        }
        uVar45 = (ulong)_c;
        if ((int)_c < 1) {
          uVar45 = uVar34;
        }
        uVar32 = (ulong)(uint)(_h * _w);
        if (_h * _w < 1) {
          uVar32 = uVar34;
        }
        for (; (long)uVar34 < (long)this->num_output; uVar34 = uVar34 + 1) {
          iVar38 = (int)uVar34;
          Mat::channel((Mat *)&opt_g,top_blob,iVar38);
          local_ba0._0_1_ = opt_g.lightmode;
          local_ba0._1_3_ = opt_g._1_3_;
          local_ba0._4_4_ = opt_g.num_threads;
          Mat::~Mat((Mat *)&opt_g);
          for (iVar44 = 0; iVar44 <= iVar2; iVar44 = iVar44 + 1) {
            for (lVar28 = 0; lVar28 <= iVar41; lVar28 = lVar28 + 1) {
              lVar40 = (long)(this->weight_data).data + (long)(int)(uVar35 * _c * iVar38);
              iVar39 = 0;
              for (uVar43 = 0; uVar43 != uVar45; uVar43 = uVar43 + 1) {
                opt_g._0_8_ = weights[0].cstep * uVar43 *
                              CONCAT44(weights[0].elemsize._4_4_,(undefined4)weights[0].elemsize) +
                              (long)weights[0].data;
                opt_g.blob_allocator._0_4_ = 0;
                opt_g.blob_allocator._4_4_ = 0;
                opt_g.workspace_allocator._0_4_ = (undefined4)weights[0].elemsize;
                opt_g.workspace_allocator._4_4_ = weights[0].elemsize._4_4_;
                opt_g.use_winograd_convolution = (bool)(undefined1)weights[0].elempack;
                opt_g.use_sgemm_convolution = (bool)weights[0].elempack._1_1_;
                opt_g.use_int8_inference = (bool)weights[0].elempack._2_1_;
                opt_g.use_vulkan_compute = (bool)weights[0].elempack._3_1_;
                opt_g._32_8_ = weights[0].allocator;
                for (uVar29 = 0; uVar42 != uVar29; uVar29 = uVar29 + 1) {
                  iVar39 = iVar39 + (int)*(char *)(lVar40 + uVar29) *
                                    (int)*(char *)(opt_g._0_8_ +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar29] +
                                                  (long)(weights[0].w * iVar44 * this->stride_h) *
                                                  CONCAT44(weights[0].elemsize._4_4_,
                                                           (undefined4)weights[0].elemsize) +
                                                  (long)this->stride_w * (long)(int)lVar28);
                }
                lVar40 = lVar40 + __n;
                Mat::~Mat((Mat *)&opt_g);
              }
              *(int *)(local_ba0 + lVar28 * 4) = iVar39;
            }
            local_ba0 = local_ba0 + (long)_w * 4;
          }
          uVar12._0_1_ = opt->lightmode;
          uVar12._1_3_ = *(undefined3 *)&opt->field_0x1;
          uVar12._4_4_ = opt->num_threads;
          m.elemsize = (size_t)opt->workspace_allocator;
          m._24_8_ = *(undefined8 *)&opt->use_winograd_convolution;
          m.allocator = *(Allocator **)&opt->use_int8_arithmetic;
          m.data = (void *)CONCAT44(1,(int)uVar12);
          m.refcount = (int *)top_blob->allocator;
          Mat::channel_range((Mat *)&opt_g,top_blob,iVar38,1);
          pLVar27 = (this->dequantize_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar34];
          (*pLVar27->_vptr_Layer[9])(pLVar27,(Mat *)&opt_g,&m);
          Mat::~Mat((Mat *)&opt_g);
          if (this->activation_type == 1) {
            Mat::channel((Mat *)&opt_g,top_blob,iVar38);
            uVar5 = opt_g._0_8_;
            Mat::~Mat((Mat *)&opt_g);
            for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
              fVar46 = *(float *)(uVar5 + uVar43 * 4);
              if (fVar46 <= 0.0) {
                fVar46 = 0.0;
              }
              *(float *)(uVar5 + uVar43 * 4) = fVar46;
            }
          }
        }
        local_bc8 = 0;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(weights);
  local_bc0 = local_bc8;
LAB_00120a0e:
  Mat::~Mat(&bottom_blob_unbordered);
  return local_bc0;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob_tm.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // requantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }       

                // activation relu
                if (activation_type == 1)
                {
                    signed char* outptr_s8 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        if (outptr_s8[i] < 0)
                            outptr_s8[i] = 0;
                    }
                }                                 
            }
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
      
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }

                // activation relu
                if (activation_type == 1)
                {
                    float* outptr_fp32 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        outptr_fp32[i] = std::max(outptr_fp32[i], 0.f);
                    }
                }
            }   
        }        

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = 1.f / (1.f + exp(-sum));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}